

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

connectdata * Curl_conncache_find_first_connection(conncache *connc)

{
  undefined8 *puVar1;
  curl_hash_element *pcVar2;
  curl_hash_iterator iter;
  curl_hash_iterator cStack_28;
  
  Curl_hash_start_iterate(&connc->hash,&cStack_28);
  pcVar2 = Curl_hash_next_element(&cStack_28);
  while( true ) {
    if (pcVar2 == (curl_hash_element *)0x0) {
      return (connectdata *)0x0;
    }
    puVar1 = *(undefined8 **)((long)pcVar2->ptr + 0x10);
    if (puVar1 != (undefined8 *)0x0) break;
    pcVar2 = Curl_hash_next_element(&cStack_28);
  }
  return (connectdata *)*puVar1;
}

Assistant:

struct connectdata *
Curl_conncache_find_first_connection(struct conncache *connc)
{
  struct curl_hash_iterator iter;
  struct curl_hash_element *he;
  struct connectbundle *bundle;

  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct curl_llist_element *curr;
    bundle = he->ptr;

    curr = bundle->conn_list.head;
    if(curr) {
      return curr->ptr;
    }

    he = Curl_hash_next_element(&iter);
  }

  return NULL;
}